

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextGLImpl.cpp
# Opt level: O0

void __thiscall Diligent::DeviceContextGLImpl::Flush(DeviceContextGLImpl *this)

{
  RenderPassGLImpl *pRVar1;
  Char *Message;
  BindInfo local_168;
  undefined1 local_30 [8];
  string msg;
  DeviceContextGLImpl *this_local;
  
  msg.field_2._8_8_ = this;
  pRVar1 = Diligent::RefCntAutoPtr::operator_cast_to_RenderPassGLImpl_
                     ((RefCntAutoPtr *)
                      &(this->super_DeviceContextBase<Diligent::EngineGLImplTraits>).
                       m_pActiveRenderPass);
  if (pRVar1 != (RenderPassGLImpl *)0x0) {
    FormatString<char[54]>
              ((string *)local_30,
               (char (*) [54])"Flushing device context inside an active render pass.");
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"Flush",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/DeviceContextGLImpl.cpp"
               ,0x604);
    std::__cxx11::string::~string((string *)local_30);
  }
  glFlush();
  BindInfo::BindInfo(&local_168);
  BindInfo::operator=(&this->m_BindInfo,&local_168);
  BindInfo::~BindInfo(&local_168);
  return;
}

Assistant:

void DeviceContextGLImpl::Flush()
{
    DEV_CHECK_ERR(m_pActiveRenderPass == nullptr, "Flushing device context inside an active render pass.");

    glFlush();

    m_BindInfo = {};
}